

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeConfig.cpp
# Opt level: O2

void __thiscall cali::RuntimeConfig::RuntimeConfigImpl::print(RuntimeConfigImpl *this,ostream *os)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  __node_base *p_Var3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>
  set;
  string local_b0 [32];
  string local_90;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter>
  entry;
  
  for (p_Var2 = (this->m_database)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_database)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2)) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>
    ::pair(&set,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>
                 *)(p_Var2 + 1));
    p_Var3 = &((set.second.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->m_dict)._M_h._M_before_begin;
    while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter>
      ::pair(&entry,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter>
                     *)(p_Var3 + 1));
      anon_unknown.dwarf_2ef27::config_var_name(&local_90,&set.first,&entry.first);
      poVar1 = std::operator<<(os,(string *)&local_90);
      poVar1 = std::operator<<(poVar1,'=');
      std::__cxx11::string::string(local_b0,(string *)&entry.second);
      poVar1 = std::operator<<(poVar1,local_b0);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter>
      ::~pair(&entry);
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>
    ::~pair(&set);
  }
  return;
}

Assistant:

void print(std::ostream& os) const
    {
        for (auto set : m_database)
            for (auto entry : set.second->m_dict)
                os << ::config_var_name(set.first, entry.first) << '=' << entry.second.to_string() << std::endl;
    }